

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMeshDecimator.cpp
# Opt level: O2

long __thiscall HACD::MeshDecimator::IsBoundaryEdge(MeshDecimator *this,long v1,long v2)

{
  pointer pMVar1;
  long lVar2;
  SArray<long,_16UL> *pSVar3;
  SArray<long,_16UL> *pSVar4;
  SArray<long,_16UL> *pSVar5;
  size_t itT1;
  size_t sVar6;
  SArray<long,_16UL> *pSVar7;
  size_t itT2;
  size_t sVar8;
  bool bVar9;
  
  pMVar1 = (this->m_vertices).super__Vector_base<HACD::MDVertex,_std::allocator<HACD::MDVertex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar6 = 0;
  pSVar3 = &pMVar1[v1].m_triangles;
  pSVar4 = &pMVar1[v2].m_triangles;
  lVar2 = -1;
  do {
    if (sVar6 == pMVar1[v1].m_triangles.m_size) {
      return lVar2;
    }
    pSVar7 = pSVar3;
    if (pSVar3->m_maxSize != 0x10) {
      pSVar7 = (SArray<long,_16UL> *)pSVar3->m_data;
    }
    for (sVar8 = 0; pSVar4->m_size != sVar8; sVar8 = sVar8 + 1) {
      pSVar5 = pSVar4;
      if (pSVar4->m_maxSize != 0x10) {
        pSVar5 = (SArray<long,_16UL> *)pSVar4->m_data;
      }
      if ((pSVar7->m_data0[sVar6] == pSVar5->m_data0[sVar8]) &&
         (bVar9 = lVar2 != -1, lVar2 = pSVar7->m_data0[sVar6], bVar9)) {
        return -1;
      }
    }
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

long MeshDecimator::IsBoundaryEdge(long v1, long v2) const
	{
		long commonTri = -1;
		long itTriangle1, itTriangle2;
		for(size_t itT1 = 0; itT1 < m_vertices[v1].m_triangles.Size(); ++itT1)
		{
            itTriangle1 = m_vertices[v1].m_triangles[itT1];
			for(size_t itT2 = 0; itT2 < m_vertices[v2].m_triangles.Size(); ++itT2)
			{
                itTriangle2 = m_vertices[v2].m_triangles[itT2];
				if (itTriangle1 == itTriangle2)
				{
					if (commonTri == -1)
					{
						commonTri = itTriangle1;
					}
					else
					{
						return -1;
					}
				}
			}
		}
		return commonTri;
	}